

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tuple.cc
# Opt level: O0

bool __thiscall xemmai::t_tuple::f_equals(t_tuple *this,t_pvalue *a_other)

{
  bool bVar1;
  t_object *ptVar2;
  t_pvalue *a_value;
  t_svalue *a_value_00;
  t_value<xemmai::t_pointer> local_50;
  t_value<xemmai::t_pointer> local_40;
  ulong local_30;
  size_t i;
  t_tuple *other;
  t_pvalue *a_other_local;
  t_tuple *this_local;
  
  other = (t_tuple *)a_other;
  a_other_local = (t_pvalue *)this;
  ptVar2 = t_pointer::operator_cast_to_t_object_(&a_other->super_t_pointer);
  bVar1 = f_is<xemmai::t_tuple>(ptVar2);
  if (bVar1) {
    ptVar2 = t_pointer::operator->((t_pointer *)other);
    i = (size_t)t_object::f_as<xemmai::t_tuple>(ptVar2);
    if (this == (t_tuple *)i) {
      this_local._7_1_ = true;
    }
    else if (this->v_size == ((t_tuple *)i)->v_size) {
      for (local_30 = 0; local_30 < this->v_size; local_30 = local_30 + 1) {
        a_value = (t_pvalue *)operator[](this,local_30);
        a_value_00 = operator[]((t_tuple *)i,local_30);
        t_value<xemmai::t_pointer>::t_value<xemmai::t_slot>(&local_50,a_value_00);
        t_value<xemmai::t_slot>::f_equals((t_value<xemmai::t_slot> *)&local_40,a_value);
        bVar1 = f_as<bool,xemmai::t_value<xemmai::t_pointer>>(&local_40);
        if (((bVar1 ^ 0xffU) & 1) != 0) {
          return false;
        }
      }
      this_local._7_1_ = true;
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool t_tuple::f_equals(const t_pvalue& a_other) const
{
	if (!f_is<t_tuple>(a_other)) return false;
	auto& other = a_other->f_as<t_tuple>();
	if (this == &other) return true;
	if (v_size != other.v_size) return false;
	for (size_t i = 0; i < v_size; ++i) if (!f_as<bool>((*this)[i].f_equals(other[i]))) return false;
	return true;
}